

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

int __thiscall MlmWrap::provideEvent(MlmWrap *this,char *event)

{
  int iVar1;
  ostream *poVar2;
  zmsg_t *msg;
  allocator local_69;
  string local_68;
  string local_48;
  zmsg_t *local_28;
  
  local_28 = czhelp_zmsg_create("ss","EVP",event);
  std::mutex::lock(&this->actormutex);
  iVar1 = zactor_send(this->actor,&local_28);
  if (iVar1 != 0) {
    std::__cxx11::string::string
              ((string *)&local_68,"Could not send \'provide event\' to actor",&local_69);
    error(&local_48,this,&local_68);
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_48);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->actormutex);
  return iVar1;
}

Assistant:

int MlmWrap::provideEvent(const char *event){
    int rc = -1;
    zmsg_t *msg = czhelp_zmsg_create("ss", eventprovide, event);
    std::lock_guard<std::mutex> lock(actormutex);
    rc = zactor_send(actor, &msg);
    if(rc){
        std::cerr << error("Could not send 'provide event' to actor") << std::endl;;
    }
    return rc;
}